

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O2

void __thiscall
SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::
MapSet<BVSparse<Memory::JitArenaAllocator>*,false>
          (SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *this,uint baseSetMember,
          _func_void_uint_BVSparse<Memory::JitArenaAllocator>_ptr *callBack,
          BVSparse<Memory::JitArenaAllocator> *accessory)

{
  uint uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  
  if (this[0x10] == (SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
                       ,0x171,"(consolidated)","consolidated");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  uVar5 = Lookup<false,true>(this,baseSetMember);
  (*callBack)(uVar5,accessory);
  uVar6 = uVar5;
  while (uVar1 = uVar6 + 1, uVar1 < *(uint *)this) {
    lVar2 = *(long *)(*(long *)(this + 8) + (ulong)(uVar1 >> 4) * 8);
    if (lVar2 == 0) {
      uVar6 = uVar6 - (uVar1 | 0xfffffff0);
    }
    else {
      uVar6 = uVar1;
      if (*(uint *)(lVar2 + (ulong)(uVar1 & 0xf) * 4) == uVar5) {
        (*callBack)(uVar1,accessory);
      }
    }
  }
  return;
}

Assistant:

inline void MapSet(indexType baseSetMember, void(*callBack)(indexType, MapAccessoryType), MapAccessoryType accessory)
    {
        Assert(consolidated);
        indexType baseSet = Lookup<false, true>(baseSetMember);
        if (!onlyNonIdentity)
        {
            callBack(baseSet, accessory);
        }
        // We now only need to look at the stuff greater than baseSet
        for (indexType i = baseSet + 1; i < maxIndex; i++)
        {
            if (backingStore[i / numPerSegment] == nullptr)
            {
                // advance to the next block if this one is an identity block
                i += (numPerSegment - (i % numPerSegment)) - 1;
                continue;
            }
            if (backingStore[i / numPerSegment][i % numPerSegment] == baseSet)
            {
                callBack(i, accessory);
            }
        }
    }